

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_smmla(DisasContext_conflict1 *s,arg_rrrr *a,_Bool round,_Bool sub)

{
  TCGContext_conflict1 *tcg_ctx;
  ulong uVar1;
  _Bool _Var2;
  TCGv_i32 rh;
  TCGv_i32 rl;
  TCGv_i32 arg2;
  TCGv_i32 al;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar1 = s->features & 8;
  }
  else {
    uVar1 = s->features >> 0x22 & 1;
  }
  if (uVar1 == 0) {
    _Var2 = false;
  }
  else {
    rh = load_reg(s,a->rn);
    rl = load_reg(s,a->rm);
    tcg_gen_muls2_i32_aarch64(tcg_ctx,rl,rh,rh,rl);
    if (a->ra != 0xf) {
      arg2 = load_reg(s,a->ra);
      if (sub) {
        al = tcg_const_i32_aarch64(tcg_ctx,0);
        tcg_gen_sub2_i32_aarch64(tcg_ctx,rl,rh,al,arg2,rl,rh);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(al + (long)tcg_ctx));
      }
      else {
        tcg_gen_add_i32(tcg_ctx,rh,rh,arg2);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    }
    if (round) {
      tcg_gen_shri_i32_aarch64(tcg_ctx,rl,rl,0x1f);
      tcg_gen_add_i32(tcg_ctx,rh,rh,rl);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
    store_reg(s,a->rd,rh);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool op_smmla(DisasContext *s, arg_rrrr *a, bool round, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_muls2_i32(tcg_ctx, t2, t1, t1, t2);

    if (a->ra != 15) {
        TCGv_i32 t3 = load_reg(s, a->ra);
        if (sub) {
            /*
             * For SMMLS, we need a 64-bit subtract.  Borrow caused by
             * a non-zero multiplicand lowpart, and the correct result
             * lowpart for rounding.
             */
            TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
            tcg_gen_sub2_i32(tcg_ctx, t2, t1, zero, t3, t2, t1);
            tcg_temp_free_i32(tcg_ctx, zero);
        } else {
            tcg_gen_add_i32(tcg_ctx, t1, t1, t3);
        }
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (round) {
        /*
         * Adding 0x80000000 to the 64-bit quantity means that we have
         * carry in to the high word when the low word has the msb set.
         */
        tcg_gen_shri_i32(tcg_ctx, t2, t2, 31);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}